

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O2

int __thiscall BinGE<1,_0,_1>::checkSatisfied(BinGE<1,_0,_1> *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  
  if ((this->super_Propagator).satisfied.v == '\0') {
    bVar4 = BoolView::isFalse(&this->r);
    if (bVar4) {
      iVar5 = 1;
    }
    else {
      iVar1 = (((this->x).var)->max).v;
      iVar3 = -iVar1;
      iVar5 = 3;
      iVar2 = (((this->y).var)->max).v;
      if (iVar2 != iVar3 && SBORROW4(iVar2,iVar3) == iVar2 + iVar1 < 0) {
        return 3;
      }
    }
    Tchar::operator=(&(this->super_Propagator).satisfied,'\x01');
  }
  else {
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

int checkSatisfied() override {
		if (satisfied) {
			return 1;
		}
		if (r.isFalse()) {
			satisfied = true;
			return 1;
		}
		if (x.getMin() >= y.getMax()) {
			satisfied = true;
		}
		return 3;
	}